

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PushStyleVar(ImGuiStyleVar idx,ImVec2 *val)

{
  int iVar1;
  ImU32 IVar2;
  ImVector<ImGuiStyleMod> *this;
  ImGuiStyleMod local_3c;
  ImVec2 *local_30;
  ImVec2 *pvar;
  ImGuiContext *g;
  ImGuiStyleVarInfo *var_info;
  ImVec2 *val_local;
  ImGuiStyleVar idx_local;
  
  var_info = (ImGuiStyleVarInfo *)val;
  val_local._4_4_ = idx;
  g = (ImGuiContext *)GetStyleVarInfo(idx);
  iVar1._0_1_ = g->Initialized;
  iVar1._1_1_ = g->FontAtlasOwnedByContext;
  iVar1._2_2_ = *(undefined2 *)&g->field_0x2;
  if ((iVar1 == 4) && (*(ImU32 *)&g->field_0x4 == 2)) {
    pvar = (ImVec2 *)GImGui;
    local_30 = (ImVec2 *)ImGuiStyleVarInfo::GetVarPtr((ImGuiStyleVarInfo *)g,&GImGui->Style);
    this = (ImVector<ImGuiStyleMod> *)(pvar + 0x337);
    ImGuiStyleMod::ImGuiStyleMod(&local_3c,val_local._4_4_,*local_30);
    ImVector<ImGuiStyleMod>::push_back(this,&local_3c);
    IVar2 = var_info->Count;
    local_30->x = (float)var_info->Type;
    local_30->y = (float)IVar2;
    return;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                ,0x1aae,"void ImGui::PushStyleVar(ImGuiStyleVar, const ImVec2 &)");
}

Assistant:

void ImGui::PushStyleVar(ImGuiStyleVar idx, const ImVec2& val)
{
    const ImGuiStyleVarInfo* var_info = GetStyleVarInfo(idx);
    if (var_info->Type == ImGuiDataType_Float && var_info->Count == 2)
    {
        ImGuiContext& g = *GImGui;
        ImVec2* pvar = (ImVec2*)var_info->GetVarPtr(&g.Style);
        g.StyleModifiers.push_back(ImGuiStyleMod(idx, *pvar));
        *pvar = val;
        return;
    }
    IM_ASSERT(0); // Called function with wrong-type? Variable is not a ImVec2.
}